

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O2

void __thiscall
miniros::Subscription::Subscription
          (Subscription *this,string *name,string *md5sum,string *datatype,
          TransportHints *transport_hints)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_enable_shared_from_this<miniros::Subscription>)._M_weak_this.
  super___weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<miniros::Subscription>)._M_weak_this.
  super___weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_Subscription = (_func_int **)&PTR__Subscription_002f1c00;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  *(undefined8 *)((long)&(this->md5sum_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->md5sum_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->md5sum_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->md5sum_mutex_).super___mutex_base._M_mutex + 8) = 0;
  (this->md5sum_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::__cxx11::string::string((string *)&this->md5sum_,(string *)md5sum);
  std::__cxx11::string::string((string *)&this->datatype_,(string *)datatype);
  *(undefined8 *)((long)&(this->shutdown_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->shutdown_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->shutdown_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->shutdown_mutex_).super___mutex_base._M_mutex + 8) = 0;
  (this->shutdown_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  p_Var1 = &(this->pending_connections_)._M_t._M_impl.super__Rb_tree_header;
  (this->pending_connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pending_connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->callbacks_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->callbacks_mutex_).super___mutex_base._M_mutex + 8) = 0;
  (this->callbacks_).
  super__Vector_base<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->callbacks_).
  super__Vector_base<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->callbacks_).
           super__Vector_base<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 6) = 0;
  *(undefined8 *)((long)&(this->callbacks_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->callbacks_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->callbacks_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->callbacks_).
  super__Vector_base<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pending_connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->pending_connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->pending_connections_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->pending_connections_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->pending_connections_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->pending_connections_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->pending_connections_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->pending_connections_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->publisher_links_).
  super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->publisher_links_).
  super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->publisher_links_).
  super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->publisher_links_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->publisher_links_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->publisher_links_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->publisher_links_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->publisher_links_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  TransportHints::TransportHints(&this->transport_hints_,transport_hints);
  StatisticsLogger::StatisticsLogger(&this->statistics_);
  p_Var1 = &(this->latched_messages_)._M_t._M_impl.super__Rb_tree_header;
  (this->latched_messages_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->latched_messages_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->latched_messages_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->latched_messages_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->latched_messages_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->cached_deserializers_).
  super__Vector_base<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>,_std::allocator<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cached_deserializers_).
  super__Vector_base<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>,_std::allocator<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cached_deserializers_).
  super__Vector_base<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>,_std::allocator<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Subscription::Subscription(const std::string &name, const std::string& md5sum, const std::string& datatype, const TransportHints& transport_hints)
: name_(name)
, md5sum_(md5sum)
, datatype_(datatype)
, nonconst_callbacks_(0)
, dropped_(false)
, shutting_down_(false)
, transport_hints_(transport_hints)
{
}